

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall BaseSocketImpl::StartClosingCB(BaseSocketImpl *this)

{
  mutex *__mutex;
  int iVar1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  BaseSocket *local_20;
  void *local_18;
  
  __mutex = &this->m_mxFnClosing;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  local_38 = (this->m_fClosingParam).super__Function_base._M_manager;
  if (local_38 == (_Manager_type)0x0) {
    local_38 = (this->m_fClosing).super__Function_base._M_manager;
    if (local_38 == (_Manager_type)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(this->m_fClosing).super__Function_base._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&(this->m_fClosing).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_fClosing).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->m_fClosing).super__Function_base._M_functor + 8) = 0;
    (this->m_fClosing).super__Function_base._M_manager = (_Manager_type)0x0;
    p_Stack_30 = (_Invoker_type)(this->m_fClosing)._M_invoker;
    (this->m_fClosing)._M_invoker = (_Invoker_type)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_20 = this->m_pBkRef;
    if (local_38 == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*p_Stack_30)(&local_48,&local_20);
    if (local_38 != (_Manager_type)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  else {
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(this->m_fClosingParam).super__Function_base._M_functor;
    local_48._8_8_ =
         *(undefined8 *)((long)&(this->m_fClosingParam).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_fClosingParam).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->m_fClosingParam).super__Function_base._M_functor + 8) = 0;
    (this->m_fClosingParam).super__Function_base._M_manager = (_Manager_type)0x0;
    p_Stack_30 = (this->m_fClosingParam)._M_invoker;
    (this->m_fClosingParam)._M_invoker = (_Invoker_type)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_18 = this->m_pvUserData;
    local_20 = this->m_pBkRef;
    if (local_38 == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*p_Stack_30)(&local_48,&local_20,&local_18);
    if (local_38 != (_Manager_type)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  return;
}

Assistant:

void BaseSocketImpl::StartClosingCB()
{
    m_mxFnClosing.lock();
    if (m_fClosingParam)
    {
        function<void(BaseSocket*, void*)> tmpfun;
        m_fClosingParam.swap(tmpfun);
        m_mxFnClosing.unlock();
        tmpfun(m_pBkRef, m_pvUserData);
    }
    else if (m_fClosing)
    {
        function<void(BaseSocket*)> tmpfun;
        m_fClosing.swap(tmpfun);
        m_mxFnClosing.unlock();
        tmpfun(m_pBkRef);
    }
    else
        m_mxFnClosing.unlock();
}